

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Maj3_PrintClause(int *pLits,int nLits)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int local_18;
  int i;
  int nLits_local;
  int *pLits_local;
  
  for (local_18 = 0; local_18 < nLits; local_18 = local_18 + 1) {
    iVar1 = Abc_LitIsCompl(pLits[local_18]);
    uVar2 = 0x2b;
    if (iVar1 != 0) {
      uVar2 = 0x2d;
    }
    uVar3 = Abc_Lit2Var(pLits[local_18]);
    printf("%c%d ",(ulong)uVar2,(ulong)uVar3);
  }
  printf("\n");
  return;
}

Assistant:

void Maj3_PrintClause( int * pLits, int nLits )
{
    int i;
    for ( i = 0; i < nLits; i++ )
        printf( "%c%d ", Abc_LitIsCompl(pLits[i]) ? '-' : '+', Abc_Lit2Var(pLits[i]) );
    printf( "\n" );
}